

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapSnow16(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  uint64_t s;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int v11;
  uint64_t cs;
  uint64_t ss;
  int err;
  int64_t j;
  int64_t i;
  int64_t pH;
  int64_t pW;
  int pZ;
  int pX;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_4;
  
  local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                      (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX + -1,in_ECX + -1,
                       (long)(in_R8D + 2),(long)(in_R9D + 2));
  if (local_4 == 0) {
    for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
      for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
        iVar2 = *(int *)(in_RSI + (local_48 + 1 + (local_50 + 1) * (long)(in_R8D + 2)) * 4);
        if (iVar2 != 0) {
          s = getChunkSeed(CONCAT44(iVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,
                           in_stack_ffffffffffffff88);
          iVar1 = mcFirstIsZero(s,5);
          iVar2 = 1;
          if (iVar1 != 0) {
            iVar2 = 0xc;
          }
        }
        *(int *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = iVar2;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mapSnow16(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[i+1 + (j+1)*pW];
            if (v11 != ocean)
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v11 = mcFirstIsZero(cs, 5) ? snowy_tundra : plains;
            }
            out[i + j*w] = v11;
        }
    }

    return 0;
}